

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 *puVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 (*pauVar31) [16];
  uint uVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  ulong uVar41;
  long lVar42;
  undefined1 (*pauVar43) [16];
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  Scene *scene;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar84 [16];
  float fVar83;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar87 [64];
  uint uVar91;
  undefined1 auVar92 [16];
  uint uVar94;
  uint uVar95;
  undefined1 auVar93 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2998) [16];
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 *local_2950;
  ulong local_2948;
  ulong local_2940;
  ulong local_2938;
  ulong local_2930;
  undefined8 *local_2928;
  Scene *local_2920;
  long local_2918;
  long local_2910;
  ulong local_2908;
  ulong local_2900;
  ulong local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  ulong local_28e0;
  ulong local_28d8;
  RTCFilterFunctionNArguments local_28d0;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2850 [16];
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  undefined1 local_2710 [16];
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_2998 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2400._4_4_ = fVar1;
  local_2400._0_4_ = fVar1;
  local_2400._8_4_ = fVar1;
  local_2400._12_4_ = fVar1;
  local_2400._16_4_ = fVar1;
  local_2400._20_4_ = fVar1;
  local_2400._24_4_ = fVar1;
  local_2400._28_4_ = fVar1;
  auVar77 = ZEXT3264(local_2400);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2420._4_4_ = fVar2;
  local_2420._0_4_ = fVar2;
  local_2420._8_4_ = fVar2;
  local_2420._12_4_ = fVar2;
  local_2420._16_4_ = fVar2;
  local_2420._20_4_ = fVar2;
  local_2420._24_4_ = fVar2;
  local_2420._28_4_ = fVar2;
  auVar82 = ZEXT3264(local_2420);
  fVar83 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2440._4_4_ = fVar83;
  local_2440._0_4_ = fVar83;
  local_2440._8_4_ = fVar83;
  local_2440._12_4_ = fVar83;
  local_2440._16_4_ = fVar83;
  local_2440._20_4_ = fVar83;
  local_2440._24_4_ = fVar83;
  local_2440._28_4_ = fVar83;
  auVar87 = ZEXT3264(local_2440);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar83 = fVar83 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2930 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2938 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2940 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2948 = local_2930 ^ 0x20;
  uVar39 = local_2938 ^ 0x20;
  uVar46 = local_2940 ^ 0x20;
  iVar36 = (tray->tfar).field_0.i[k];
  auVar58 = ZEXT3264(CONCAT428(iVar36,CONCAT424(iVar36,CONCAT420(iVar36,CONCAT416(iVar36,CONCAT412(
                                                  iVar36,CONCAT48(iVar36,CONCAT44(iVar36,iVar36)))))
                                               )));
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2460._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar1;
  local_2460._12_4_ = -fVar1;
  local_2460._16_4_ = -fVar1;
  local_2460._20_4_ = -fVar1;
  local_2460._24_4_ = -fVar1;
  local_2460._28_4_ = -fVar1;
  auVar93 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar2;
  local_2480._12_4_ = -fVar2;
  local_2480._16_4_ = -fVar2;
  local_2480._20_4_ = -fVar2;
  local_2480._24_4_ = -fVar2;
  local_2480._28_4_ = -fVar2;
  auVar99 = ZEXT3264(local_2480);
  local_24a0._0_8_ = CONCAT44(fVar83,fVar83) ^ 0x8000000080000000;
  local_24a0._8_4_ = -fVar83;
  local_24a0._12_4_ = -fVar83;
  local_24a0._16_4_ = -fVar83;
  local_24a0._20_4_ = -fVar83;
  local_24a0._24_4_ = -fVar83;
  local_24a0._28_4_ = -fVar83;
  auVar105 = ZEXT3264(local_24a0);
  iVar36 = (tray->tnear).field_0.i[k];
  local_24c0._4_4_ = iVar36;
  local_24c0._0_4_ = iVar36;
  local_24c0._8_4_ = iVar36;
  local_24c0._12_4_ = iVar36;
  local_24c0._16_4_ = iVar36;
  local_24c0._20_4_ = iVar36;
  local_24c0._24_4_ = iVar36;
  local_24c0._28_4_ = iVar36;
  auVar108 = ZEXT3264(local_24c0);
  local_24e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24e0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2928 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = &DAT_3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar55._16_4_ = 0x3f800000;
  auVar55._20_4_ = 0x3f800000;
  auVar55._24_4_ = 0x3f800000;
  auVar55._28_4_ = 0x3f800000;
  auVar81._8_4_ = 0xbf800000;
  auVar81._0_8_ = 0xbf800000bf800000;
  auVar81._12_4_ = 0xbf800000;
  auVar81._16_4_ = 0xbf800000;
  auVar81._20_4_ = 0xbf800000;
  auVar81._24_4_ = 0xbf800000;
  auVar81._28_4_ = 0xbf800000;
  local_2500 = vblendvps_avx(auVar55,auVar81,local_24e0);
  uVar38 = local_2930;
  uVar37 = local_2940;
  uVar44 = local_2948;
  uVar45 = local_2938;
  local_2950 = local_2928;
  do {
    do {
      do {
        if (local_2998 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar31 = local_2998 + -1;
        local_2998 = local_2998 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar31 + 8));
      uVar51 = *(ulong *)*local_2998;
      do {
        auVar101 = auVar105._0_32_;
        auVar96 = auVar99._0_32_;
        auVar62 = auVar93._0_32_;
        auVar85 = auVar87._0_32_;
        auVar55 = auVar82._0_32_;
        auVar81 = auVar77._0_32_;
        if ((uVar51 & 8) == 0) {
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar66._4_4_ = uVar3;
          auVar66._0_4_ = uVar3;
          auVar66._8_4_ = uVar3;
          auVar66._12_4_ = uVar3;
          auVar66._16_4_ = uVar3;
          auVar66._20_4_ = uVar3;
          auVar66._24_4_ = uVar3;
          auVar66._28_4_ = uVar3;
          uVar33 = uVar51 & 0xfffffffffffffff0;
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar38),auVar66,
                                    *(undefined1 (*) [32])(uVar33 + 0x40 + uVar38));
          auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar45),auVar66,
                                    *(undefined1 (*) [32])(uVar33 + 0x40 + uVar45));
          auVar63 = vfmadd213ps_fma(ZEXT1632(auVar63),auVar81,auVar62);
          auVar64 = vfmadd213ps_fma(ZEXT1632(auVar64),auVar55,auVar96);
          auVar18 = vpmaxsd_avx2(ZEXT1632(auVar63),ZEXT1632(auVar64));
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar37),auVar66,
                                    *(undefined1 (*) [32])(uVar33 + 0x40 + uVar37));
          auVar63 = vfmadd213ps_fma(ZEXT1632(auVar63),auVar85,auVar101);
          auVar19 = vpmaxsd_avx2(ZEXT1632(auVar63),auVar108._0_32_);
          local_26e0 = vpmaxsd_avx2(auVar18,auVar19);
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar44),auVar66,
                                    *(undefined1 (*) [32])(uVar33 + 0x40 + uVar44));
          auVar63 = vfmadd213ps_fma(ZEXT1632(auVar63),auVar81,auVar62);
          auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar39),auVar66,
                                    *(undefined1 (*) [32])(uVar33 + 0x40 + uVar39));
          auVar64 = vfmadd213ps_fma(ZEXT1632(auVar64),auVar55,auVar96);
          auVar68 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar46),auVar66,
                                    *(undefined1 (*) [32])(uVar33 + 0x40 + uVar46));
          auVar18 = vpminsd_avx2(ZEXT1632(auVar63),ZEXT1632(auVar64));
          auVar63 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar85,auVar101);
          auVar19 = vpminsd_avx2(ZEXT1632(auVar63),auVar58._0_32_);
          auVar18 = vpminsd_avx2(auVar18,auVar19);
          auVar18 = vcmpps_avx(local_26e0,auVar18,2);
          if (((uint)uVar51 & 7) == 6) {
            auVar19 = vcmpps_avx(*(undefined1 (*) [32])(uVar33 + 0x1c0),auVar66,2);
            auVar66 = vcmpps_avx(auVar66,*(undefined1 (*) [32])(uVar33 + 0x1e0),1);
            auVar19 = vandps_avx(auVar19,auVar66);
            auVar18 = vandps_avx(auVar19,auVar18);
            auVar63 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          }
          else {
            auVar63 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
          }
          auVar63 = vpsllw_avx(auVar63,0xf);
          auVar63 = vpacksswb_avx(auVar63,auVar63);
          local_2928 = (undefined8 *)
                       (ulong)(byte)(SUB161(auVar63 >> 7,0) & 1 |
                                     (SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar63 >> 0x3f,0) << 7);
        }
        if ((uVar51 & 8) == 0) {
          if (local_2928 == (undefined8 *)0x0) {
            iVar36 = 4;
          }
          else {
            uVar33 = uVar51 & 0xfffffffffffffff0;
            lVar35 = 0;
            for (puVar20 = local_2928; ((ulong)puVar20 & 1) == 0;
                puVar20 = (undefined8 *)((ulong)puVar20 >> 1 | 0x8000000000000000)) {
              lVar35 = lVar35 + 1;
            }
            iVar36 = 0;
            uVar41 = (long)local_2928 - 1U & (ulong)local_2928;
            uVar51 = *(ulong *)(uVar33 + lVar35 * 8);
            if (uVar41 != 0) {
              uVar91 = *(uint *)(local_26e0 + lVar35 * 4);
              lVar35 = 0;
              for (uVar48 = uVar41; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                lVar35 = lVar35 + 1;
              }
              uVar41 = uVar41 - 1 & uVar41;
              uVar48 = *(ulong *)(uVar33 + lVar35 * 8);
              uVar32 = *(uint *)(local_26e0 + lVar35 * 4);
              if (uVar41 == 0) {
                if (uVar91 < uVar32) {
                  *(ulong *)*local_2998 = uVar48;
                  *(uint *)(*local_2998 + 8) = uVar32;
                  local_2998 = local_2998 + 1;
                }
                else {
                  *(ulong *)*local_2998 = uVar51;
                  *(uint *)(*local_2998 + 8) = uVar91;
                  uVar51 = uVar48;
                  local_2998 = local_2998 + 1;
                }
              }
              else {
                auVar63._8_8_ = 0;
                auVar63._0_8_ = uVar51;
                auVar63 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar91));
                auVar64._8_8_ = 0;
                auVar64._0_8_ = uVar48;
                auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar32));
                lVar35 = 0;
                for (uVar51 = uVar41; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000)
                {
                  lVar35 = lVar35 + 1;
                }
                uVar41 = uVar41 - 1 & uVar41;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = *(ulong *)(uVar33 + lVar35 * 8);
                auVar59 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_26e0 + lVar35 * 4)));
                auVar68 = vpcmpgtd_avx(auVar64,auVar63);
                if (uVar41 == 0) {
                  auVar72 = vpshufd_avx(auVar68,0xaa);
                  auVar68 = vblendvps_avx(auVar64,auVar63,auVar72);
                  auVar63 = vblendvps_avx(auVar63,auVar64,auVar72);
                  auVar64 = vpcmpgtd_avx(auVar59,auVar68);
                  auVar72 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar59,auVar68,auVar72);
                  auVar68 = vblendvps_avx(auVar68,auVar59,auVar72);
                  auVar59 = vpcmpgtd_avx(auVar68,auVar63);
                  auVar72 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar68,auVar63,auVar72);
                  auVar63 = vblendvps_avx(auVar63,auVar68,auVar72);
                  *local_2998 = auVar63;
                  local_2998[1] = auVar59;
                  uVar51 = auVar64._0_8_;
                  local_2998 = local_2998 + 2;
                }
                else {
                  lVar35 = 0;
                  for (uVar51 = uVar41; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000
                      ) {
                    lVar35 = lVar35 + 1;
                  }
                  uVar41 = uVar41 - 1 & uVar41;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = *(ulong *)(uVar33 + lVar35 * 8);
                  auVar72 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_26e0 + lVar35 * 4)));
                  if (uVar41 == 0) {
                    auVar52 = vpshufd_avx(auVar68,0xaa);
                    auVar68 = vblendvps_avx(auVar64,auVar63,auVar52);
                    auVar63 = vblendvps_avx(auVar63,auVar64,auVar52);
                    auVar64 = vpcmpgtd_avx(auVar72,auVar59);
                    auVar52 = vpshufd_avx(auVar64,0xaa);
                    auVar64 = vblendvps_avx(auVar72,auVar59,auVar52);
                    auVar59 = vblendvps_avx(auVar59,auVar72,auVar52);
                    auVar72 = vpcmpgtd_avx(auVar59,auVar63);
                    auVar52 = vpshufd_avx(auVar72,0xaa);
                    auVar72 = vblendvps_avx(auVar59,auVar63,auVar52);
                    auVar63 = vblendvps_avx(auVar63,auVar59,auVar52);
                    auVar59 = vpcmpgtd_avx(auVar64,auVar68);
                    auVar52 = vpshufd_avx(auVar59,0xaa);
                    auVar59 = vblendvps_avx(auVar64,auVar68,auVar52);
                    auVar64 = vblendvps_avx(auVar68,auVar64,auVar52);
                    auVar68 = vpcmpgtd_avx(auVar72,auVar64);
                    auVar52 = vpshufd_avx(auVar68,0xaa);
                    auVar68 = vblendvps_avx(auVar72,auVar64,auVar52);
                    auVar64 = vblendvps_avx(auVar64,auVar72,auVar52);
                    *local_2998 = auVar63;
                    local_2998[1] = auVar64;
                    local_2998[2] = auVar68;
                    uVar51 = auVar59._0_8_;
                    local_2998 = local_2998 + 3;
                  }
                  else {
                    *local_2998 = auVar63;
                    local_2998[1] = auVar64;
                    local_2998[2] = auVar59;
                    local_2998[3] = auVar72;
                    lVar35 = 0x30;
                    do {
                      lVar42 = lVar35;
                      lVar35 = 0;
                      for (uVar51 = uVar41; (uVar51 & 1) == 0;
                          uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                        lVar35 = lVar35 + 1;
                      }
                      auVar59._8_8_ = 0;
                      auVar59._0_8_ = *(ulong *)(uVar33 + lVar35 * 8);
                      auVar63 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_26e0 + lVar35 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2998[1] + lVar42) = auVar63;
                      uVar41 = uVar41 - 1 & uVar41;
                      lVar35 = lVar42 + 0x10;
                    } while (uVar41 != 0);
                    pauVar31 = (undefined1 (*) [16])(local_2998[1] + lVar42);
                    if (lVar42 + 0x10 != 0) {
                      lVar35 = 0x10;
                      pauVar40 = local_2998;
                      do {
                        uVar29 = *(undefined8 *)pauVar40[1];
                        uVar30 = *(undefined8 *)(pauVar40[1] + 8);
                        uVar91 = *(uint *)(pauVar40[1] + 8);
                        pauVar40 = pauVar40 + 1;
                        lVar42 = lVar35;
                        do {
                          if (uVar91 <= *(uint *)(local_2998[-1] + lVar42 + 8)) {
                            pauVar43 = (undefined1 (*) [16])(*local_2998 + lVar42);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2998 + lVar42) =
                               *(undefined1 (*) [16])(local_2998[-1] + lVar42);
                          lVar42 = lVar42 + -0x10;
                          pauVar43 = local_2998;
                        } while (lVar42 != 0);
                        *(undefined8 *)*pauVar43 = uVar29;
                        *(undefined8 *)(*pauVar43 + 8) = uVar30;
                        lVar35 = lVar35 + 0x10;
                      } while (pauVar31 != pauVar40);
                    }
                    uVar51 = *(ulong *)*pauVar31;
                    local_2998 = pauVar31;
                  }
                  auVar77 = ZEXT3264(auVar81);
                  auVar82 = ZEXT3264(auVar55);
                  auVar87 = ZEXT3264(auVar85);
                  auVar93 = ZEXT3264(auVar62);
                  auVar99 = ZEXT3264(auVar96);
                  auVar105 = ZEXT3264(auVar101);
                  auVar108 = ZEXT3264(auVar108._0_32_);
                }
              }
            }
          }
        }
        else {
          iVar36 = 6;
        }
      } while (iVar36 == 0);
    } while (iVar36 != 6);
    local_2918 = (ulong)((uint)uVar51 & 0xf) - 8;
    if (local_2918 != 0) {
      uVar51 = uVar51 & 0xfffffffffffffff0;
      lVar35 = 0;
      do {
        lVar34 = lVar35 * 0x60;
        pSVar7 = context->scene;
        pRVar8 = (pSVar7->geometries).items;
        pGVar9 = pRVar8[*(uint *)(uVar51 + 0x40 + lVar34)].ptr;
        fVar1 = (pGVar9->time_range).lower;
        fVar1 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar9->time_range).upper - fVar1));
        auVar63 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        auVar63 = vminss_avx(auVar63,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
        auVar73 = vmaxss_avx(ZEXT816(0) << 0x20,auVar63);
        iVar36 = (int)auVar73._0_4_;
        lVar47 = (long)iVar36 * 0x38;
        lVar42 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar47);
        local_2900 = (ulong)*(uint *)(uVar51 + 4 + lVar34);
        auVar63 = *(undefined1 (*) [16])(lVar42 + (ulong)*(uint *)(uVar51 + lVar34) * 4);
        local_28e0 = (ulong)*(uint *)(uVar51 + 0x10 + lVar34);
        auVar64 = *(undefined1 (*) [16])(lVar42 + local_28e0 * 4);
        uVar37 = (ulong)*(uint *)(uVar51 + 0x20 + lVar34);
        auVar68 = *(undefined1 (*) [16])(lVar42 + uVar37 * 4);
        uVar44 = (ulong)*(uint *)(uVar51 + 0x30 + lVar34);
        auVar59 = *(undefined1 (*) [16])(lVar42 + uVar44 * 4);
        local_2910 = *(long *)&pRVar8[*(uint *)(uVar51 + 0x44 + lVar34)].ptr[2].numPrimitives;
        lVar42 = *(long *)(local_2910 + lVar47);
        auVar72 = *(undefined1 (*) [16])(lVar42 + local_2900 * 4);
        local_28f0 = (ulong)*(uint *)(uVar51 + 0x14 + lVar34);
        auVar52 = *(undefined1 (*) [16])(lVar42 + local_28f0 * 4);
        local_28e8 = (ulong)*(uint *)(uVar51 + 0x24 + lVar34);
        auVar5 = *(undefined1 (*) [16])(lVar42 + local_28e8 * 4);
        local_28d8 = (ulong)*(uint *)(uVar51 + 0x34 + lVar34);
        auVar6 = *(undefined1 (*) [16])(lVar42 + local_28d8 * 4);
        lVar42 = *(long *)&pRVar8[*(uint *)(uVar51 + 0x48 + lVar34)].ptr[2].numPrimitives;
        lVar10 = *(long *)(lVar42 + lVar47);
        uVar45 = (ulong)*(uint *)(uVar51 + 8 + lVar34);
        auVar65 = *(undefined1 (*) [16])(lVar10 + uVar45 * 4);
        uVar50 = (ulong)*(uint *)(uVar51 + 0x18 + lVar34);
        auVar61 = *(undefined1 (*) [16])(lVar10 + uVar50 * 4);
        local_2908 = (ulong)*(uint *)(uVar51 + 0x28 + lVar34);
        auVar60 = *(undefined1 (*) [16])(lVar10 + local_2908 * 4);
        local_28f8 = (ulong)*(uint *)(uVar51 + 0x38 + lVar34);
        auVar69 = *(undefined1 (*) [16])(lVar10 + local_28f8 * 4);
        fVar1 = fVar1 - auVar73._0_4_;
        lVar10 = *(long *)&pRVar8[*(uint *)(uVar51 + 0x4c + lVar34)].ptr[2].numPrimitives;
        lVar47 = *(long *)(lVar10 + lVar47);
        uVar38 = (ulong)*(uint *)(uVar51 + 0xc + lVar34);
        auVar73 = *(undefined1 (*) [16])(lVar47 + uVar38 * 4);
        uVar48 = (ulong)*(uint *)(uVar51 + 0x1c + lVar34);
        auVar84 = *(undefined1 (*) [16])(lVar47 + uVar48 * 4);
        auVar71 = vunpcklps_avx(auVar63,auVar65);
        auVar65 = vunpckhps_avx(auVar63,auVar65);
        auVar75 = vunpcklps_avx(auVar72,auVar73);
        auVar72 = vunpckhps_avx(auVar72,auVar73);
        uVar33 = (ulong)*(uint *)(uVar51 + 0x2c + lVar34);
        auVar63 = *(undefined1 (*) [16])(lVar47 + uVar33 * 4);
        local_27c0 = vunpcklps_avx(auVar65,auVar72);
        auVar65 = vunpcklps_avx(auVar71,auVar75);
        local_27e0 = vunpckhps_avx(auVar71,auVar75);
        auVar73 = vunpcklps_avx(auVar64,auVar61);
        auVar72 = vunpckhps_avx(auVar64,auVar61);
        auVar61 = vunpcklps_avx(auVar52,auVar84);
        auVar52 = vunpckhps_avx(auVar52,auVar84);
        uVar41 = (ulong)*(uint *)(uVar51 + 0x3c + lVar34);
        auVar64 = *(undefined1 (*) [16])(lVar47 + uVar41 * 4);
        local_27b0 = vunpcklps_avx(auVar72,auVar52);
        local_27f0 = vunpcklps_avx(auVar73,auVar61);
        local_27d0 = vunpckhps_avx(auVar73,auVar61);
        auVar52 = vunpcklps_avx(auVar68,auVar60);
        auVar68 = vunpckhps_avx(auVar68,auVar60);
        auVar61 = vunpcklps_avx(auVar5,auVar63);
        auVar72 = vunpckhps_avx(auVar5,auVar63);
        lVar49 = (long)(iVar36 + 1) * 0x38;
        lVar47 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar49);
        auVar63 = *(undefined1 (*) [16])(lVar47 + (ulong)*(uint *)(uVar51 + lVar34) * 4);
        local_2800 = vunpcklps_avx(auVar68,auVar72);
        local_2840 = vunpcklps_avx(auVar52,auVar61);
        local_2820 = vunpckhps_avx(auVar52,auVar61);
        auVar72 = vunpcklps_avx(auVar59,auVar69);
        auVar68 = vunpckhps_avx(auVar59,auVar69);
        auVar52 = vunpcklps_avx(auVar6,auVar64);
        auVar59 = vunpckhps_avx(auVar6,auVar64);
        lVar42 = *(long *)(lVar42 + lVar49);
        auVar64 = *(undefined1 (*) [16])(lVar42 + uVar45 * 4);
        local_2810 = vunpcklps_avx(auVar68,auVar59);
        local_2850 = vunpcklps_avx(auVar72,auVar52);
        local_2830 = vunpckhps_avx(auVar72,auVar52);
        lVar11 = *(long *)(local_2910 + lVar49);
        auVar59 = vunpcklps_avx(auVar63,auVar64);
        auVar68 = vunpckhps_avx(auVar63,auVar64);
        auVar63 = *(undefined1 (*) [16])(lVar11 + local_2900 * 4);
        lVar10 = *(long *)(lVar10 + lVar49);
        auVar64 = *(undefined1 (*) [16])(lVar10 + uVar38 * 4);
        auVar72 = vunpcklps_avx(auVar63,auVar64);
        auVar63 = vunpckhps_avx(auVar63,auVar64);
        auVar5 = vunpcklps_avx(auVar68,auVar63);
        auVar6 = vunpcklps_avx(auVar59,auVar72);
        auVar68 = vunpckhps_avx(auVar59,auVar72);
        auVar63 = *(undefined1 (*) [16])(lVar47 + local_28e0 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar42 + uVar50 * 4);
        auVar72 = vunpcklps_avx(auVar63,auVar64);
        auVar59 = vunpckhps_avx(auVar63,auVar64);
        auVar63 = *(undefined1 (*) [16])(lVar11 + local_28f0 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar10 + uVar48 * 4);
        auVar52 = vunpcklps_avx(auVar63,auVar64);
        auVar63 = vunpckhps_avx(auVar63,auVar64);
        auVar61 = vunpcklps_avx(auVar59,auVar63);
        auVar60 = vunpcklps_avx(auVar72,auVar52);
        auVar59 = vunpckhps_avx(auVar72,auVar52);
        auVar63 = *(undefined1 (*) [16])(lVar47 + uVar37 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar42 + local_2908 * 4);
        auVar52 = vunpcklps_avx(auVar63,auVar64);
        auVar72 = vunpckhps_avx(auVar63,auVar64);
        auVar63 = *(undefined1 (*) [16])(lVar11 + local_28e8 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar10 + uVar33 * 4);
        auVar69 = vunpcklps_avx(auVar63,auVar64);
        auVar63 = vunpckhps_avx(auVar63,auVar64);
        auVar73 = vunpcklps_avx(auVar72,auVar63);
        auVar84 = vunpcklps_avx(auVar52,auVar69);
        auVar72 = vunpckhps_avx(auVar52,auVar69);
        auVar63 = *(undefined1 (*) [16])(lVar47 + uVar44 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar42 + local_28f8 * 4);
        auVar69 = vunpcklps_avx(auVar63,auVar64);
        auVar52 = vunpckhps_avx(auVar63,auVar64);
        auVar63 = *(undefined1 (*) [16])(lVar11 + local_28d8 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar10 + uVar41 * 4);
        auVar71 = vunpcklps_avx(auVar63,auVar64);
        auVar63 = vunpckhps_avx(auVar63,auVar64);
        auVar64 = vunpcklps_avx(auVar52,auVar63);
        auVar52 = vunpcklps_avx(auVar69,auVar71);
        auVar63 = vunpckhps_avx(auVar69,auVar71);
        fVar2 = 1.0 - fVar1;
        auVar109._4_4_ = fVar2;
        auVar109._0_4_ = fVar2;
        auVar109._8_4_ = fVar2;
        auVar109._12_4_ = fVar2;
        auVar69._0_4_ = fVar1 * auVar6._0_4_;
        auVar69._4_4_ = fVar1 * auVar6._4_4_;
        auVar69._8_4_ = fVar1 * auVar6._8_4_;
        auVar69._12_4_ = fVar1 * auVar6._12_4_;
        auVar6 = vfmadd231ps_fma(auVar69,auVar109,auVar65);
        auVar75._0_4_ = fVar1 * auVar68._0_4_;
        auVar75._4_4_ = fVar1 * auVar68._4_4_;
        auVar75._8_4_ = fVar1 * auVar68._8_4_;
        auVar75._12_4_ = fVar1 * auVar68._12_4_;
        auVar68 = vfmadd231ps_fma(auVar75,auVar109,local_27e0);
        auVar71._0_4_ = auVar5._0_4_ * fVar1;
        auVar71._4_4_ = auVar5._4_4_ * fVar1;
        auVar71._8_4_ = auVar5._8_4_ * fVar1;
        auVar71._12_4_ = auVar5._12_4_ * fVar1;
        auVar5 = vfmadd231ps_fma(auVar71,auVar109,local_27c0);
        auVar65._0_4_ = fVar1 * auVar60._0_4_;
        auVar65._4_4_ = fVar1 * auVar60._4_4_;
        auVar65._8_4_ = fVar1 * auVar60._8_4_;
        auVar65._12_4_ = fVar1 * auVar60._12_4_;
        auVar65 = vfmadd231ps_fma(auVar65,auVar109,local_27f0);
        auVar60._0_4_ = fVar1 * auVar59._0_4_;
        auVar60._4_4_ = fVar1 * auVar59._4_4_;
        auVar60._8_4_ = fVar1 * auVar59._8_4_;
        auVar60._12_4_ = fVar1 * auVar59._12_4_;
        auVar59 = vfmadd231ps_fma(auVar60,auVar109,local_27d0);
        auVar78._0_4_ = auVar61._0_4_ * fVar1;
        auVar78._4_4_ = auVar61._4_4_ * fVar1;
        auVar78._8_4_ = auVar61._8_4_ * fVar1;
        auVar78._12_4_ = auVar61._12_4_ * fVar1;
        auVar61 = vfmadd231ps_fma(auVar78,auVar109,local_27b0);
        auVar92._0_4_ = auVar84._0_4_ * fVar1;
        auVar92._4_4_ = auVar84._4_4_ * fVar1;
        auVar92._8_4_ = auVar84._8_4_ * fVar1;
        auVar92._12_4_ = auVar84._12_4_ * fVar1;
        auVar60 = vfmadd231ps_fma(auVar92,auVar109,local_2840);
        auVar100._0_4_ = auVar72._0_4_ * fVar1;
        auVar100._4_4_ = auVar72._4_4_ * fVar1;
        auVar100._8_4_ = auVar72._8_4_ * fVar1;
        auVar100._12_4_ = auVar72._12_4_ * fVar1;
        auVar72 = vfmadd231ps_fma(auVar100,auVar109,local_2820);
        auVar106._0_4_ = auVar73._0_4_ * fVar1;
        auVar106._4_4_ = auVar73._4_4_ * fVar1;
        auVar106._8_4_ = auVar73._8_4_ * fVar1;
        auVar106._12_4_ = auVar73._12_4_ * fVar1;
        auVar69 = vfmadd231ps_fma(auVar106,auVar109,local_2800);
        auVar73._0_4_ = fVar1 * auVar52._0_4_;
        auVar73._4_4_ = fVar1 * auVar52._4_4_;
        auVar73._8_4_ = fVar1 * auVar52._8_4_;
        auVar73._12_4_ = fVar1 * auVar52._12_4_;
        auVar84._0_4_ = auVar63._0_4_ * fVar1;
        auVar84._4_4_ = auVar63._4_4_ * fVar1;
        auVar84._8_4_ = auVar63._8_4_ * fVar1;
        auVar84._12_4_ = auVar63._12_4_ * fVar1;
        auVar52._0_4_ = auVar64._0_4_ * fVar1;
        auVar52._4_4_ = auVar64._4_4_ * fVar1;
        auVar52._8_4_ = auVar64._8_4_ * fVar1;
        auVar52._12_4_ = auVar64._12_4_ * fVar1;
        lVar42 = uVar51 + 0x40 + lVar34;
        local_23c0 = *(undefined8 *)(lVar42 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar42 + 0x18);
        auVar63 = vfmadd231ps_fma(auVar73,auVar109,local_2850);
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        lVar34 = uVar51 + 0x50 + lVar34;
        local_27a0 = *(undefined8 *)(lVar34 + 0x10);
        uStack_2798 = *(undefined8 *)(lVar34 + 0x18);
        auVar64 = vfmadd231ps_fma(auVar84,auVar109,local_2830);
        auVar52 = vfmadd231ps_fma(auVar52,auVar109,local_2810);
        uStack_2790 = local_27a0;
        uStack_2788 = uStack_2798;
        auVar70._16_16_ = auVar60;
        auVar70._0_16_ = auVar6;
        auVar76._16_16_ = auVar72;
        auVar76._0_16_ = auVar68;
        auVar102._16_16_ = auVar69;
        auVar102._0_16_ = auVar5;
        auVar67._16_16_ = auVar65;
        auVar67._0_16_ = auVar65;
        auVar62._16_16_ = auVar59;
        auVar62._0_16_ = auVar59;
        auVar79._16_16_ = auVar61;
        auVar79._0_16_ = auVar61;
        auVar74._16_16_ = auVar63;
        auVar74._0_16_ = auVar63;
        auVar97._16_16_ = auVar64;
        auVar97._0_16_ = auVar64;
        auVar53._16_16_ = auVar52;
        auVar53._0_16_ = auVar52;
        auVar55 = vsubps_avx(auVar70,auVar67);
        auVar81 = vsubps_avx(auVar76,auVar62);
        auVar85 = vsubps_avx(auVar102,auVar79);
        auVar62 = vsubps_avx(auVar74,auVar70);
        auVar96 = vsubps_avx(auVar97,auVar76);
        auVar101 = vsubps_avx(auVar53,auVar102);
        auVar18._4_4_ = auVar81._4_4_ * auVar101._4_4_;
        auVar18._0_4_ = auVar81._0_4_ * auVar101._0_4_;
        auVar18._8_4_ = auVar81._8_4_ * auVar101._8_4_;
        auVar18._12_4_ = auVar81._12_4_ * auVar101._12_4_;
        auVar18._16_4_ = auVar81._16_4_ * auVar101._16_4_;
        auVar18._20_4_ = auVar81._20_4_ * auVar101._20_4_;
        auVar18._24_4_ = auVar81._24_4_ * auVar101._24_4_;
        auVar18._28_4_ = auVar52._12_4_;
        auVar72 = vfmsub231ps_fma(auVar18,auVar96,auVar85);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar80._4_4_ = uVar3;
        auVar80._0_4_ = uVar3;
        auVar80._8_4_ = uVar3;
        auVar80._12_4_ = uVar3;
        auVar80._16_4_ = uVar3;
        auVar80._20_4_ = uVar3;
        auVar80._24_4_ = uVar3;
        auVar80._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar111._4_4_ = uVar3;
        auVar111._0_4_ = uVar3;
        auVar111._8_4_ = uVar3;
        auVar111._12_4_ = uVar3;
        auVar111._16_4_ = uVar3;
        auVar111._20_4_ = uVar3;
        auVar111._24_4_ = uVar3;
        auVar111._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar113._4_4_ = uVar3;
        auVar113._0_4_ = uVar3;
        auVar113._8_4_ = uVar3;
        auVar113._12_4_ = uVar3;
        auVar113._16_4_ = uVar3;
        auVar113._20_4_ = uVar3;
        auVar113._24_4_ = uVar3;
        auVar113._28_4_ = uVar3;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar98._4_4_ = fVar1;
        auVar98._0_4_ = fVar1;
        auVar98._8_4_ = fVar1;
        auVar98._12_4_ = fVar1;
        auVar98._16_4_ = fVar1;
        auVar98._20_4_ = fVar1;
        auVar98._24_4_ = fVar1;
        auVar98._28_4_ = fVar1;
        auVar19._4_4_ = auVar85._4_4_ * auVar62._4_4_;
        auVar19._0_4_ = auVar85._0_4_ * auVar62._0_4_;
        auVar19._8_4_ = auVar85._8_4_ * auVar62._8_4_;
        auVar19._12_4_ = auVar85._12_4_ * auVar62._12_4_;
        auVar19._16_4_ = auVar85._16_4_ * auVar62._16_4_;
        auVar19._20_4_ = auVar85._20_4_ * auVar62._20_4_;
        auVar19._24_4_ = auVar85._24_4_ * auVar62._24_4_;
        auVar19._28_4_ = auVar59._12_4_;
        auVar18 = vsubps_avx(auVar70,auVar80);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar110._4_4_ = fVar2;
        auVar110._0_4_ = fVar2;
        auVar110._8_4_ = fVar2;
        auVar110._12_4_ = fVar2;
        auVar110._16_4_ = fVar2;
        auVar110._20_4_ = fVar2;
        auVar110._24_4_ = fVar2;
        auVar110._28_4_ = fVar2;
        auVar59 = vfmsub231ps_fma(auVar19,auVar101,auVar55);
        auVar19 = vsubps_avx(auVar76,auVar111);
        fVar83 = *(float *)(ray + k * 4 + 0x60);
        auVar112._4_4_ = fVar83;
        auVar112._0_4_ = fVar83;
        auVar112._8_4_ = fVar83;
        auVar112._12_4_ = fVar83;
        auVar112._16_4_ = fVar83;
        auVar112._20_4_ = fVar83;
        auVar112._24_4_ = fVar83;
        auVar112._28_4_ = fVar83;
        auVar66 = vsubps_avx(auVar102,auVar113);
        auVar21._4_4_ = fVar1 * auVar19._4_4_;
        auVar21._0_4_ = fVar1 * auVar19._0_4_;
        auVar21._8_4_ = fVar1 * auVar19._8_4_;
        auVar21._12_4_ = fVar1 * auVar19._12_4_;
        auVar21._16_4_ = fVar1 * auVar19._16_4_;
        auVar21._20_4_ = fVar1 * auVar19._20_4_;
        auVar21._24_4_ = fVar1 * auVar19._24_4_;
        auVar21._28_4_ = auVar69._12_4_;
        auVar63 = vfmsub231ps_fma(auVar21,auVar18,auVar110);
        auVar22._4_4_ = auVar101._4_4_ * auVar63._4_4_;
        auVar22._0_4_ = auVar101._0_4_ * auVar63._0_4_;
        auVar22._8_4_ = auVar101._8_4_ * auVar63._8_4_;
        auVar22._12_4_ = auVar101._12_4_ * auVar63._12_4_;
        auVar22._16_4_ = auVar101._16_4_ * 0.0;
        auVar22._20_4_ = auVar101._20_4_ * 0.0;
        auVar22._24_4_ = auVar101._24_4_ * 0.0;
        auVar22._28_4_ = auVar101._28_4_;
        auVar103._0_4_ = auVar85._0_4_ * auVar63._0_4_;
        auVar103._4_4_ = auVar85._4_4_ * auVar63._4_4_;
        auVar103._8_4_ = auVar85._8_4_ * auVar63._8_4_;
        auVar103._12_4_ = auVar85._12_4_ * auVar63._12_4_;
        auVar103._16_4_ = auVar85._16_4_ * 0.0;
        auVar103._20_4_ = auVar85._20_4_ * 0.0;
        auVar103._24_4_ = auVar85._24_4_ * 0.0;
        auVar103._28_4_ = 0;
        auVar101._4_4_ = fVar83 * auVar18._4_4_;
        auVar101._0_4_ = fVar83 * auVar18._0_4_;
        auVar101._8_4_ = fVar83 * auVar18._8_4_;
        auVar101._12_4_ = fVar83 * auVar18._12_4_;
        auVar101._16_4_ = fVar83 * auVar18._16_4_;
        auVar101._20_4_ = fVar83 * auVar18._20_4_;
        auVar101._24_4_ = fVar83 * auVar18._24_4_;
        auVar101._28_4_ = auVar85._28_4_;
        auVar64 = vfmsub231ps_fma(auVar101,auVar66,auVar98);
        auVar63 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar64),auVar96);
        auVar64 = vfmadd231ps_fma(auVar103,auVar81,ZEXT1632(auVar64));
        auVar85._4_4_ = auVar55._4_4_ * auVar96._4_4_;
        auVar85._0_4_ = auVar55._0_4_ * auVar96._0_4_;
        auVar85._8_4_ = auVar55._8_4_ * auVar96._8_4_;
        auVar85._12_4_ = auVar55._12_4_ * auVar96._12_4_;
        auVar85._16_4_ = auVar55._16_4_ * auVar96._16_4_;
        auVar85._20_4_ = auVar55._20_4_ * auVar96._20_4_;
        auVar85._24_4_ = auVar55._24_4_ * auVar96._24_4_;
        auVar85._28_4_ = auVar96._28_4_;
        auVar52 = vfmsub231ps_fma(auVar85,auVar62,auVar81);
        auVar96._4_4_ = fVar2 * auVar66._4_4_;
        auVar96._0_4_ = fVar2 * auVar66._0_4_;
        auVar96._8_4_ = fVar2 * auVar66._8_4_;
        auVar96._12_4_ = fVar2 * auVar66._12_4_;
        auVar96._16_4_ = fVar2 * auVar66._16_4_;
        auVar96._20_4_ = fVar2 * auVar66._20_4_;
        auVar96._24_4_ = fVar2 * auVar66._24_4_;
        auVar96._28_4_ = auVar81._28_4_;
        auVar5 = vfmsub231ps_fma(auVar96,auVar19,auVar112);
        fVar1 = auVar52._0_4_;
        fVar2 = auVar52._4_4_;
        auVar23._4_4_ = fVar83 * fVar2;
        auVar23._0_4_ = fVar83 * fVar1;
        fVar13 = auVar52._8_4_;
        auVar23._8_4_ = fVar83 * fVar13;
        fVar14 = auVar52._12_4_;
        auVar23._12_4_ = fVar83 * fVar14;
        auVar23._16_4_ = fVar83 * 0.0;
        auVar23._20_4_ = fVar83 * 0.0;
        auVar23._24_4_ = fVar83 * 0.0;
        auVar23._28_4_ = fVar83;
        auVar68 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar59),auVar110);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar72),auVar98);
        auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),ZEXT1632(auVar5),auVar62);
        auVar81 = vandps_avx(ZEXT1632(auVar68),local_23e0);
        uVar91 = auVar81._0_4_;
        local_26e0._0_4_ = (float)(uVar91 ^ auVar63._0_4_);
        uVar32 = auVar81._4_4_;
        local_26e0._4_4_ = (float)(uVar32 ^ auVar63._4_4_);
        uVar94 = auVar81._8_4_;
        local_26e0._8_4_ = (float)(uVar94 ^ auVar63._8_4_);
        uVar95 = auVar81._12_4_;
        local_26e0._12_4_ = (float)(uVar95 ^ auVar63._12_4_);
        local_26a0._16_4_ = auVar81._16_4_;
        local_26e0._16_4_ = local_26a0._16_4_;
        local_26a0._20_4_ = auVar81._20_4_;
        local_26e0._20_4_ = local_26a0._20_4_;
        local_26a0._24_4_ = auVar81._24_4_;
        local_26e0._24_4_ = local_26a0._24_4_;
        local_26a0._28_4_ = auVar81._28_4_;
        local_26e0._28_4_ = local_26a0._28_4_;
        auVar63 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar55,ZEXT1632(auVar5));
        local_26c0._0_4_ = (float)(uVar91 ^ auVar63._0_4_);
        local_26c0._4_4_ = (float)(uVar32 ^ auVar63._4_4_);
        local_26c0._8_4_ = (float)(uVar94 ^ auVar63._8_4_);
        local_26c0._12_4_ = (float)(uVar95 ^ auVar63._12_4_);
        local_26c0._16_4_ = local_26a0._16_4_;
        local_26c0._20_4_ = local_26a0._20_4_;
        local_26c0._24_4_ = local_26a0._24_4_;
        local_26c0._28_4_ = local_26a0._28_4_;
        auVar81 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
        auVar55 = vcmpps_avx(local_26c0,ZEXT832(0) << 0x20,5);
        auVar81 = vandps_avx(auVar81,auVar55);
        auVar86._8_4_ = 0x7fffffff;
        auVar86._0_8_ = 0x7fffffff7fffffff;
        auVar86._12_4_ = 0x7fffffff;
        auVar86._16_4_ = 0x7fffffff;
        auVar86._20_4_ = 0x7fffffff;
        auVar86._24_4_ = 0x7fffffff;
        auVar86._28_4_ = 0x7fffffff;
        local_2680 = vandps_avx(ZEXT1632(auVar68),auVar86);
        auVar55 = vcmpps_avx(ZEXT1632(auVar68),ZEXT832(0) << 0x20,4);
        auVar81 = vandps_avx(auVar81,auVar55);
        auVar104._0_4_ = local_26e0._0_4_ + local_26c0._0_4_;
        auVar104._4_4_ = local_26e0._4_4_ + local_26c0._4_4_;
        auVar104._8_4_ = local_26e0._8_4_ + local_26c0._8_4_;
        auVar104._12_4_ = local_26e0._12_4_ + local_26c0._12_4_;
        auVar104._16_4_ = local_26a0._16_4_ + local_26a0._16_4_;
        auVar104._20_4_ = local_26a0._20_4_ + local_26a0._20_4_;
        auVar104._24_4_ = local_26a0._24_4_ + local_26a0._24_4_;
        auVar104._28_4_ = local_26a0._28_4_ + local_26a0._28_4_;
        auVar55 = vcmpps_avx(auVar104,local_2680,2);
        auVar85 = auVar55 & auVar81;
        if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0x7f,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0xbf,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar85[0x1f] < '\0') {
          auVar81 = vandps_avx(auVar81,auVar55);
          auVar63 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
          auVar24._4_4_ = fVar2 * auVar66._4_4_;
          auVar24._0_4_ = fVar1 * auVar66._0_4_;
          auVar24._8_4_ = fVar13 * auVar66._8_4_;
          auVar24._12_4_ = fVar14 * auVar66._12_4_;
          auVar24._16_4_ = auVar66._16_4_ * 0.0;
          auVar24._20_4_ = auVar66._20_4_ * 0.0;
          auVar24._24_4_ = auVar66._24_4_ * 0.0;
          auVar24._28_4_ = auVar66._28_4_;
          auVar64 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar59),auVar24);
          auVar64 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar72),ZEXT1632(auVar64));
          local_26a0._0_4_ = (float)(uVar91 ^ auVar64._0_4_);
          local_26a0._4_4_ = (float)(uVar32 ^ auVar64._4_4_);
          local_26a0._8_4_ = (float)(uVar94 ^ auVar64._8_4_);
          local_26a0._12_4_ = (float)(uVar95 ^ auVar64._12_4_);
          fVar83 = *(float *)(ray + k * 4 + 0x30);
          auVar25._4_4_ = local_2680._4_4_ * fVar83;
          auVar25._0_4_ = local_2680._0_4_ * fVar83;
          auVar25._8_4_ = local_2680._8_4_ * fVar83;
          auVar25._12_4_ = local_2680._12_4_ * fVar83;
          auVar25._16_4_ = local_2680._16_4_ * fVar83;
          auVar25._20_4_ = local_2680._20_4_ * fVar83;
          auVar25._24_4_ = local_2680._24_4_ * fVar83;
          auVar25._28_4_ = fVar83;
          auVar81 = vcmpps_avx(auVar25,local_26a0,1);
          fVar83 = *(float *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = local_2680._4_4_ * fVar83;
          auVar26._0_4_ = local_2680._0_4_ * fVar83;
          auVar26._8_4_ = local_2680._8_4_ * fVar83;
          auVar26._12_4_ = local_2680._12_4_ * fVar83;
          auVar26._16_4_ = local_2680._16_4_ * fVar83;
          auVar26._20_4_ = local_2680._20_4_ * fVar83;
          auVar26._24_4_ = local_2680._24_4_ * fVar83;
          auVar26._28_4_ = fVar83;
          auVar55 = vcmpps_avx(local_26a0,auVar26,2);
          auVar81 = vandps_avx(auVar81,auVar55);
          auVar64 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
          auVar63 = vpand_avx(auVar63,auVar64);
          auVar81 = vpmovzxwd_avx2(auVar63);
          auVar81 = vpslld_avx2(auVar81,0x1f);
          if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar81 >> 0x7f,0) != '\0') ||
                (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar81 >> 0xbf,0) != '\0') ||
              (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar81[0x1f] < '\0') {
            local_28a0 = vpsrad_avx2(auVar81,0x1f);
            local_2660 = ZEXT1632(auVar72);
            local_2640 = ZEXT1632(auVar59);
            local_2620 = ZEXT1632(auVar52);
            local_2600 = local_28a0;
            local_2520 = local_24e0;
            auVar55 = vrcpps_avx(local_2680);
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = &DAT_3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar107._16_4_ = 0x3f800000;
            auVar107._20_4_ = 0x3f800000;
            auVar107._24_4_ = 0x3f800000;
            auVar107._28_4_ = 0x3f800000;
            auVar64 = vfnmadd213ps_fma(local_2680,auVar55,auVar107);
            auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar55,auVar55);
            fVar83 = auVar64._0_4_;
            fVar88 = auVar64._4_4_;
            local_25a0._4_4_ = fVar88 * local_26a0._4_4_;
            local_25a0._0_4_ = fVar83 * local_26a0._0_4_;
            fVar89 = auVar64._8_4_;
            local_25a0._8_4_ = fVar89 * local_26a0._8_4_;
            fVar90 = auVar64._12_4_;
            local_25a0._12_4_ = fVar90 * local_26a0._12_4_;
            local_25a0._16_4_ = local_26a0._16_4_ * 0.0;
            local_25a0._20_4_ = local_26a0._20_4_ * 0.0;
            local_25a0._24_4_ = local_26a0._24_4_ * 0.0;
            local_25a0._28_4_ = auVar55._28_4_;
            auVar58 = ZEXT3264(local_25a0);
            auVar27._4_4_ = fVar88 * local_26e0._4_4_;
            auVar27._0_4_ = fVar83 * local_26e0._0_4_;
            auVar27._8_4_ = fVar89 * local_26e0._8_4_;
            auVar27._12_4_ = fVar90 * local_26e0._12_4_;
            auVar27._16_4_ = local_26a0._16_4_ * 0.0;
            auVar27._20_4_ = local_26a0._20_4_ * 0.0;
            auVar27._24_4_ = local_26a0._24_4_ * 0.0;
            auVar27._28_4_ = local_26a0._28_4_;
            auVar55 = vminps_avx(auVar27,auVar107);
            auVar28._4_4_ = fVar88 * local_26c0._4_4_;
            auVar28._0_4_ = fVar83 * local_26c0._0_4_;
            auVar28._8_4_ = fVar89 * local_26c0._8_4_;
            auVar28._12_4_ = fVar90 * local_26c0._12_4_;
            auVar28._16_4_ = local_26a0._16_4_ * 0.0;
            auVar28._20_4_ = local_26a0._20_4_ * 0.0;
            auVar28._24_4_ = local_26a0._24_4_ * 0.0;
            auVar28._28_4_ = local_26a0._28_4_;
            auVar85 = vminps_avx(auVar28,auVar107);
            auVar62 = vsubps_avx(auVar107,auVar55);
            auVar96 = vsubps_avx(auVar107,auVar85);
            local_25c0 = vblendvps_avx(auVar85,auVar62,local_24e0);
            local_25e0 = vblendvps_avx(auVar55,auVar96,local_24e0);
            fVar83 = local_2500._0_4_;
            local_2580._0_4_ = auVar72._0_4_ * fVar83;
            fVar88 = local_2500._4_4_;
            local_2580._4_4_ = auVar72._4_4_ * fVar88;
            fVar89 = local_2500._8_4_;
            local_2580._8_4_ = auVar72._8_4_ * fVar89;
            fVar90 = local_2500._12_4_;
            local_2580._12_4_ = auVar72._12_4_ * fVar90;
            fVar15 = local_2500._16_4_;
            local_2580._16_4_ = fVar15 * 0.0;
            fVar16 = local_2500._20_4_;
            local_2580._20_4_ = fVar16 * 0.0;
            fVar17 = local_2500._24_4_;
            local_2580._24_4_ = fVar17 * 0.0;
            local_2580._28_4_ = 0;
            local_2560._0_4_ = fVar83 * auVar59._0_4_;
            local_2560._4_4_ = fVar88 * auVar59._4_4_;
            local_2560._8_4_ = fVar89 * auVar59._8_4_;
            local_2560._12_4_ = fVar90 * auVar59._12_4_;
            local_2560._16_4_ = fVar15 * 0.0;
            local_2560._20_4_ = fVar16 * 0.0;
            local_2560._24_4_ = fVar17 * 0.0;
            local_2560._28_4_ = 0;
            local_2540._0_4_ = fVar83 * fVar1;
            local_2540._4_4_ = fVar88 * fVar2;
            local_2540._8_4_ = fVar89 * fVar13;
            local_2540._12_4_ = fVar90 * fVar14;
            local_2540._16_4_ = fVar15 * 0.0;
            local_2540._20_4_ = fVar16 * 0.0;
            local_2540._24_4_ = fVar17 * 0.0;
            local_2540._28_4_ = 0;
            auVar54._8_4_ = 0x7f800000;
            auVar54._0_8_ = 0x7f8000007f800000;
            auVar54._12_4_ = 0x7f800000;
            auVar54._16_4_ = 0x7f800000;
            auVar54._20_4_ = 0x7f800000;
            auVar54._24_4_ = 0x7f800000;
            auVar54._28_4_ = 0x7f800000;
            auVar81 = vblendvps_avx(auVar54,local_25a0,auVar81);
            auVar55 = vshufps_avx(auVar81,auVar81,0xb1);
            auVar55 = vminps_avx(auVar81,auVar55);
            auVar85 = vshufpd_avx(auVar55,auVar55,5);
            auVar55 = vminps_avx(auVar55,auVar85);
            auVar85 = vpermpd_avx2(auVar55,0x4e);
            auVar55 = vminps_avx(auVar55,auVar85);
            auVar81 = vcmpps_avx(auVar81,auVar55,0);
            auVar64 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
            auVar63 = vpand_avx(auVar64,auVar63);
            auVar81 = vpmovzxwd_avx2(auVar63);
            auVar55 = vpslld_avx2(auVar81,0x1f);
            auVar81 = local_28a0;
            if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0x7f,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0xbf,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar55[0x1f] < '\0') {
              auVar81 = vpsrad_avx2(auVar55,0x1f);
            }
            auVar77 = ZEXT3264(auVar81);
            local_2920 = pSVar7;
LAB_0066e2e8:
            uVar32 = vmovmskps_avx(auVar77._0_32_);
            uVar91 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
              uVar91 = uVar91 + 1;
            }
            uVar38 = (ulong)uVar91;
            uVar32 = *(uint *)((long)&local_23c0 + uVar38 * 4);
            pGVar9 = (pSVar7->geometries).items[uVar32].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_28a0 + uVar38 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar38 = (ulong)(uVar91 << 2);
                uVar3 = *(undefined4 *)(local_25e0 + uVar38);
                uVar4 = *(undefined4 *)(local_25c0 + uVar38);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar38);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2580 + uVar38);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2560 + uVar38);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2540 + uVar38);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_27a0 + uVar38);
                *(uint *)(ray + k * 4 + 0x120) = uVar32;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0066e111;
              }
              local_2880 = auVar58._0_32_;
              uVar37 = (ulong)(uVar91 * 4);
              uVar3 = *(undefined4 *)(local_25e0 + uVar37);
              local_2740._4_4_ = uVar3;
              local_2740._0_4_ = uVar3;
              local_2740._8_4_ = uVar3;
              local_2740._12_4_ = uVar3;
              local_2730 = *(undefined4 *)(local_25c0 + uVar37);
              local_2710._4_4_ = uVar32;
              local_2710._0_4_ = uVar32;
              local_2710._8_4_ = uVar32;
              local_2710._12_4_ = uVar32;
              local_2720 = *(undefined4 *)((long)&local_27a0 + uVar37);
              uVar3 = *(undefined4 *)(local_2580 + uVar37);
              uVar4 = *(undefined4 *)(local_2560 + uVar37);
              local_2760._4_4_ = uVar4;
              local_2760._0_4_ = uVar4;
              local_2760._8_4_ = uVar4;
              local_2760._12_4_ = uVar4;
              uVar4 = *(undefined4 *)(local_2540 + uVar37);
              local_2750._4_4_ = uVar4;
              local_2750._0_4_ = uVar4;
              local_2750._8_4_ = uVar4;
              local_2750._12_4_ = uVar4;
              local_2770[0] = (RTCHitN)(char)uVar3;
              local_2770[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_2770[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_2770[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              local_2770[4] = (RTCHitN)(char)uVar3;
              local_2770[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_2770[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_2770[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              local_2770[8] = (RTCHitN)(char)uVar3;
              local_2770[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_2770[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_2770[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              local_2770[0xc] = (RTCHitN)(char)uVar3;
              local_2770[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
              local_2770[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
              local_2770[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
              uStack_272c = local_2730;
              uStack_2728 = local_2730;
              uStack_2724 = local_2730;
              uStack_271c = local_2720;
              uStack_2718 = local_2720;
              uStack_2714 = local_2720;
              vpcmpeqd_avx2(ZEXT1632(local_2740),ZEXT1632(local_2740));
              uStack_26fc = context->user->instID[0];
              local_2700 = uStack_26fc;
              uStack_26f8 = uStack_26fc;
              uStack_26f4 = uStack_26fc;
              uStack_26f0 = context->user->instPrimID[0];
              uStack_26ec = uStack_26f0;
              uStack_26e8 = uStack_26f0;
              uStack_26e4 = uStack_26f0;
              uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar37);
              local_2960 = *local_2950;
              uStack_2958 = local_2950[1];
              local_28d0.valid = (int *)&local_2960;
              local_28d0.geometryUserPtr = pGVar9->userPtr;
              local_28d0.context = context->user;
              local_28d0.hit = local_2770;
              local_28d0.N = 4;
              local_28d0.ray = (RTCRayN *)ray;
              if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar9->intersectionFilterN)(&local_28d0);
              }
              auVar5._8_8_ = uStack_2958;
              auVar5._0_8_ = local_2960;
              if (auVar5 == (undefined1  [16])0x0) {
                auVar63 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar63 = auVar63 ^ _DAT_01febe20;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var12)(&local_28d0);
                }
                auVar6._8_8_ = uStack_2958;
                auVar6._0_8_ = local_2960;
                auVar64 = vpcmpeqd_avx(auVar6,_DAT_01feba10);
                auVar63 = auVar64 ^ _DAT_01febe20;
                if (auVar6 != (undefined1  [16])0x0) {
                  auVar64 = auVar64 ^ _DAT_01febe20;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])local_28d0.hit);
                  *(undefined1 (*) [16])(local_28d0.ray + 0xc0) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x10));
                  *(undefined1 (*) [16])(local_28d0.ray + 0xd0) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x20));
                  *(undefined1 (*) [16])(local_28d0.ray + 0xe0) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x30));
                  *(undefined1 (*) [16])(local_28d0.ray + 0xf0) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x40));
                  *(undefined1 (*) [16])(local_28d0.ray + 0x100) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x50));
                  *(undefined1 (*) [16])(local_28d0.ray + 0x110) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x60));
                  *(undefined1 (*) [16])(local_28d0.ray + 0x120) = auVar68;
                  auVar68 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x70));
                  *(undefined1 (*) [16])(local_28d0.ray + 0x130) = auVar68;
                  auVar64 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])(local_28d0.hit + 0x80));
                  *(undefined1 (*) [16])(local_28d0.ray + 0x140) = auVar64;
                }
              }
              auVar61._8_8_ = 0x100000001;
              auVar61._0_8_ = 0x100000001;
              if ((auVar61 & auVar63) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar3;
              }
              *(undefined4 *)(local_28a0 + uVar38 * 4) = 0;
              uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar57._4_4_ = uVar3;
              auVar57._0_4_ = uVar3;
              auVar57._8_4_ = uVar3;
              auVar57._12_4_ = uVar3;
              auVar57._16_4_ = uVar3;
              auVar57._20_4_ = uVar3;
              auVar57._24_4_ = uVar3;
              auVar57._28_4_ = uVar3;
              auVar58 = ZEXT3264(local_2880);
              auVar81 = vcmpps_avx(local_2880,auVar57,2);
              local_28a0 = vandps_avx(auVar81,local_28a0);
            }
            auVar77 = ZEXT3264(local_28a0);
            if ((((((((local_28a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_28a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_28a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_28a0 >> 0x7f,0) == '\0') &&
                  (local_28a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_28a0 >> 0xbf,0) == '\0') &&
                (local_28a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_28a0[0x1f]) goto LAB_0066e111;
            auVar56._8_4_ = 0x7f800000;
            auVar56._0_8_ = 0x7f8000007f800000;
            auVar56._12_4_ = 0x7f800000;
            auVar56._16_4_ = 0x7f800000;
            auVar56._20_4_ = 0x7f800000;
            auVar56._24_4_ = 0x7f800000;
            auVar56._28_4_ = 0x7f800000;
            auVar81 = vblendvps_avx(auVar56,auVar58._0_32_,local_28a0);
            auVar55 = vshufps_avx(auVar81,auVar81,0xb1);
            auVar55 = vminps_avx(auVar81,auVar55);
            auVar85 = vshufpd_avx(auVar55,auVar55,5);
            auVar55 = vminps_avx(auVar55,auVar85);
            auVar85 = vpermpd_avx2(auVar55,0x4e);
            auVar55 = vminps_avx(auVar55,auVar85);
            auVar81 = vcmpps_avx(auVar81,auVar55,0);
            auVar55 = local_28a0 & auVar81;
            if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0x7f,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0xbf,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar55[0x1f] < '\0') {
              auVar81 = vandps_avx(auVar81,local_28a0);
              auVar77 = ZEXT3264(auVar81);
            }
            goto LAB_0066e2e8;
          }
        }
LAB_0066e111:
        lVar35 = lVar35 + 1;
      } while (lVar35 != local_2918);
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar58 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    auVar77 = ZEXT3264(local_2400);
    auVar82 = ZEXT3264(local_2420);
    auVar87 = ZEXT3264(local_2440);
    auVar93 = ZEXT3264(local_2460);
    auVar99 = ZEXT3264(local_2480);
    auVar105 = ZEXT3264(local_24a0);
    auVar108 = ZEXT3264(local_24c0);
    uVar38 = local_2930;
    uVar37 = local_2940;
    uVar44 = local_2948;
    uVar45 = local_2938;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }